

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O0

int32_t icu_63::CollationFastLatin::compareUTF16
                  (uint16_t *table,uint16_t *primaries,int32_t options,UChar *left,
                  int32_t leftLength,UChar *right,int32_t rightLength)

{
  UBool UVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint32_t rightQuaternary;
  uint32_t leftQuaternary;
  UChar32 c_9;
  UChar32 c_8;
  uint32_t rightTertiary;
  uint32_t leftTertiary;
  UChar32 c_7;
  UChar32 c_6;
  UBool withCaseBits;
  uint32_t rightCase;
  uint32_t leftCase;
  UChar32 c_5;
  UChar32 c_4;
  UBool strengthIsPrimary;
  uint32_t rightSecondary;
  uint32_t leftSecondary;
  UChar32 c_3;
  UChar32 c_2;
  uint32_t rightPrimary;
  uint32_t leftPrimary;
  UChar32 c_1;
  UChar32 c;
  uint32_t rightPair;
  uint32_t leftPair;
  int32_t rightIndex;
  int32_t leftIndex;
  uint32_t variableTop;
  UChar *right_local;
  UChar *pUStack_30;
  int32_t leftLength_local;
  UChar *left_local;
  uint16_t *puStack_20;
  int32_t options_local;
  uint16_t *primaries_local;
  uint16_t *table_local;
  
  primaries_local = table + (int)(*table & 0xff);
  rightIndex = (uint)options >> 0x10;
  left_local._4_4_ = options & 0xffff;
  leftPair = 0;
  rightPair = 0;
  c = 0;
  c_1 = 0;
  _leftIndex = right;
  right_local._4_4_ = leftLength;
  pUStack_30 = left;
  puStack_20 = primaries;
LAB_002a92e5:
  while (c == 0) {
    if (leftPair == right_local._4_4_) {
      c = 2;
      break;
    }
    uVar5 = leftPair + 1;
    uVar3 = (uint)(ushort)pUStack_30[(int)leftPair];
    leftPair = uVar5;
    if (uVar3 < 0x180) {
      c = (UChar32)puStack_20[(int)uVar3];
      if (c != 0) break;
      if (((uVar3 < 0x3a) && (0x2f < uVar3)) && ((left_local._4_4_ & 2) != 0)) {
        return -2;
      }
      c = (UChar32)primaries_local[(int)uVar3];
    }
    else if ((uVar3 < 0x2000) || (0x203f < uVar3)) {
      c = lookup(primaries_local,uVar3);
    }
    else {
      c = (UChar32)primaries_local[(int)(uVar3 - 0x1e80)];
    }
    if (0xfff < (uint)c) {
      c = c & 0xfc00;
      break;
    }
    if ((uint)rightIndex < (uint)c) {
      c = c & 0xfff8;
      break;
    }
    uVar5 = nextPair(primaries_local,uVar3,c,pUStack_30,(uint8_t *)0x0,(int32_t *)&leftPair,
                     (int32_t *)((long)&right_local + 4));
    if (uVar5 == 1) {
      return -2;
    }
    c = getPrimaries(rightIndex,uVar5);
  }
  while (c_1 == 0) {
    if (rightPair == rightLength) {
      c_1 = 2;
      break;
    }
    uVar5 = rightPair + 1;
    uVar3 = (uint)(ushort)_leftIndex[(int)rightPair];
    rightPair = uVar5;
    if (uVar3 < 0x180) {
      c_1 = (UChar32)puStack_20[(int)uVar3];
      if (c_1 != 0) break;
      if (((uVar3 < 0x3a) && (0x2f < uVar3)) && ((left_local._4_4_ & 2) != 0)) {
        return -2;
      }
      c_1 = (UChar32)primaries_local[(int)uVar3];
    }
    else if ((uVar3 < 0x2000) || (0x203f < uVar3)) {
      c_1 = lookup(primaries_local,uVar3);
    }
    else {
      c_1 = (UChar32)primaries_local[(int)(uVar3 - 0x1e80)];
    }
    if (0xfff < (uint)c_1) {
      c_1 = c_1 & 0xfc00;
      break;
    }
    if ((uint)rightIndex < (uint)c_1) {
      c_1 = c_1 & 0xfff8;
      break;
    }
    uVar5 = nextPair(primaries_local,uVar3,c_1,_leftIndex,(uint8_t *)0x0,(int32_t *)&rightPair,
                     &rightLength);
    if (uVar5 == 1) {
      return -2;
    }
    c_1 = getPrimaries(rightIndex,uVar5);
  }
  if (c == c_1) {
    if (c != 2) {
      c_1 = 0;
      c = 0;
      goto LAB_002a92e5;
    }
  }
  else {
    if ((c & 0xffffU) != (c_1 & 0xffffU)) {
      if ((c & 0xffffU) < (c_1 & 0xffffU)) {
        return -1;
      }
      return 1;
    }
    if (c != 2) {
      c = (uint)c >> 0x10;
      c_1 = (uint)c_1 >> 0x10;
      goto LAB_002a92e5;
    }
  }
  iVar2 = CollationSettings::getStrength(left_local._4_4_);
  if (iVar2 < 1) goto LAB_002a98b2;
  rightPair = 0;
  leftPair = 0;
  c_1 = 0;
  c = 0;
LAB_002a9627:
  if (c == 0) {
    if (leftPair == right_local._4_4_) {
      c = 2;
      goto LAB_002a9720;
    }
    uVar5 = leftPair + 1;
    uVar3 = (uint)(ushort)pUStack_30[(int)leftPair];
    leftPair = uVar5;
    if (uVar3 < 0x180) {
      c = (UChar32)primaries_local[(int)uVar3];
    }
    else if ((uVar3 < 0x2000) || (0x203f < uVar3)) {
      c = lookup(primaries_local,uVar3);
    }
    else {
      c = (UChar32)primaries_local[(int)(uVar3 - 0x1e80)];
    }
    if (0xfff < (uint)c) {
      c = getSecondariesFromOneShortCE(c);
      goto LAB_002a9720;
    }
    if ((uint)rightIndex < (uint)c) {
      c = 0xc0;
      goto LAB_002a9720;
    }
    uVar5 = nextPair(primaries_local,uVar3,c,pUStack_30,(uint8_t *)0x0,(int32_t *)&leftPair,
                     (int32_t *)((long)&right_local + 4));
    c = getSecondaries(rightIndex,uVar5);
    goto LAB_002a9627;
  }
LAB_002a9720:
  while (c_1 == 0) {
    if (rightPair == rightLength) {
      c_1 = 2;
      break;
    }
    uVar5 = rightPair + 1;
    uVar3 = (uint)(ushort)_leftIndex[(int)rightPair];
    rightPair = uVar5;
    if (uVar3 < 0x180) {
      c_1 = (UChar32)primaries_local[(int)uVar3];
    }
    else if ((uVar3 < 0x2000) || (0x203f < uVar3)) {
      c_1 = lookup(primaries_local,uVar3);
    }
    else {
      c_1 = (UChar32)primaries_local[(int)(uVar3 - 0x1e80)];
    }
    if (0xfff < (uint)c_1) {
      c_1 = getSecondariesFromOneShortCE(c_1);
      break;
    }
    if ((uint)rightIndex < (uint)c_1) {
      c_1 = 0xc0;
      break;
    }
    uVar5 = nextPair(primaries_local,uVar3,c_1,_leftIndex,(uint8_t *)0x0,(int32_t *)&rightPair,
                     &rightLength);
    c_1 = getSecondaries(rightIndex,uVar5);
  }
  if (c == c_1) {
    if (c == 2) goto LAB_002a98b2;
    c_1 = 0;
    c = 0;
    goto LAB_002a9627;
  }
  if ((c & 0xffffU) != (c_1 & 0xffffU)) {
    if ((left_local._4_4_ & 0x800) != 0) {
      return -2;
    }
    if ((c & 0xffffU) < (c_1 & 0xffffU)) {
      return -1;
    }
    return 1;
  }
  if (c != 2) {
    c = (uint)c >> 0x10;
    c_1 = (uint)c_1 >> 0x10;
    goto LAB_002a9627;
  }
LAB_002a98b2:
  if ((left_local._4_4_ & 0x400) != 0) {
    iVar2 = CollationSettings::getStrength(left_local._4_4_);
    rightPair = 0;
    leftPair = 0;
    c_1 = 0;
    c = 0;
LAB_002a98f4:
    for (; c == 0; c = getCases(rightIndex,iVar2 == 0,c)) {
      if (leftPair == right_local._4_4_) {
        c = 2;
        break;
      }
      uVar3 = (uint)(ushort)pUStack_30[(int)leftPair];
      if (uVar3 < 0x180) {
        local_b0 = (uint)primaries_local[(int)uVar3];
        leftPair = leftPair + 1;
      }
      else {
        leftPair = leftPair + 1;
        local_b0 = lookup(primaries_local,uVar3);
      }
      c = local_b0;
      if (local_b0 < 0xc00) {
        c = nextPair(primaries_local,uVar3,local_b0,pUStack_30,(uint8_t *)0x0,(int32_t *)&leftPair,
                     (int32_t *)((long)&right_local + 4));
      }
    }
    for (; c_1 == 0; c_1 = getCases(rightIndex,iVar2 == 0,c_1)) {
      if (rightPair == rightLength) {
        c_1 = 2;
        break;
      }
      uVar3 = (uint)(ushort)_leftIndex[(int)rightPair];
      if (uVar3 < 0x180) {
        local_b4 = (uint)primaries_local[(int)uVar3];
        rightPair = rightPair + 1;
      }
      else {
        rightPair = rightPair + 1;
        local_b4 = lookup(primaries_local,uVar3);
      }
      c_1 = local_b4;
      if (local_b4 < 0xc00) {
        c_1 = nextPair(primaries_local,uVar3,local_b4,_leftIndex,(uint8_t *)0x0,
                       (int32_t *)&rightPair,&rightLength);
      }
    }
    if (c == c_1) {
      if (c == 2) goto LAB_002a9b12;
      c_1 = 0;
      c = 0;
      goto LAB_002a98f4;
    }
    uVar3 = c & 0xffff;
    uVar4 = c_1 & 0xffff;
    if (uVar3 != uVar4) {
      if ((left_local._4_4_ & 0x100) != 0) {
        if (uVar3 < uVar4) {
          return 1;
        }
        return -1;
      }
      if (uVar3 < uVar4) {
        return -1;
      }
      return 1;
    }
    if (c != 2) {
      c = (uint)c >> 0x10;
      c_1 = (uint)c_1 >> 0x10;
      goto LAB_002a98f4;
    }
  }
LAB_002a9b12:
  iVar2 = CollationSettings::getStrength(left_local._4_4_);
  if (1 < iVar2) {
    UVar1 = CollationSettings::isTertiaryWithCaseBits(left_local._4_4_);
    rightPair = 0;
    leftPair = 0;
    c_1 = 0;
    c = 0;
LAB_002a9b57:
    for (; c == 0; c = getTertiaries(rightIndex,UVar1,c)) {
      if (leftPair == right_local._4_4_) {
        c = 2;
        break;
      }
      uVar3 = (uint)(ushort)pUStack_30[(int)leftPair];
      if (uVar3 < 0x180) {
        local_b8 = (uint)primaries_local[(int)uVar3];
        leftPair = leftPair + 1;
      }
      else {
        leftPair = leftPair + 1;
        local_b8 = lookup(primaries_local,uVar3);
      }
      c = local_b8;
      if (local_b8 < 0xc00) {
        c = nextPair(primaries_local,uVar3,local_b8,pUStack_30,(uint8_t *)0x0,(int32_t *)&leftPair,
                     (int32_t *)((long)&right_local + 4));
      }
    }
    for (; c_1 == 0; c_1 = getTertiaries(rightIndex,UVar1,c_1)) {
      if (rightPair == rightLength) {
        c_1 = 2;
        break;
      }
      uVar3 = (uint)(ushort)_leftIndex[(int)rightPair];
      if (uVar3 < 0x180) {
        local_bc = (uint)primaries_local[(int)uVar3];
        rightPair = rightPair + 1;
      }
      else {
        rightPair = rightPair + 1;
        local_bc = lookup(primaries_local,uVar3);
      }
      c_1 = local_bc;
      if (local_bc < 0xc00) {
        c_1 = nextPair(primaries_local,uVar3,local_bc,_leftIndex,(uint8_t *)0x0,
                       (int32_t *)&rightPair,&rightLength);
      }
    }
    if (c == c_1) {
      if (c == 2) goto LAB_002a9dbd;
      c_1 = 0;
      c = 0;
      goto LAB_002a9b57;
    }
    c_8 = c & 0xffff;
    c_9 = c_1 & 0xffff;
    if (c_8 != c_9) {
      UVar1 = CollationSettings::sortsTertiaryUpperCaseFirst(left_local._4_4_);
      if (UVar1 != '\0') {
        if (3 < (uint)c_8) {
          c_8 = c_8 ^ 0x18;
        }
        if (3 < (uint)c_9) {
          c_9 = c_9 ^ 0x18;
        }
      }
      if ((uint)c_8 < (uint)c_9) {
        return -1;
      }
      return 1;
    }
    if (c != 2) {
      c = (uint)c >> 0x10;
      c_1 = (uint)c_1 >> 0x10;
      goto LAB_002a9b57;
    }
LAB_002a9dbd:
    iVar2 = CollationSettings::getStrength(left_local._4_4_);
    if (2 < iVar2) {
      rightPair = 0;
      leftPair = 0;
      c_1 = 0;
      c = 0;
      do {
        while (c != 0) {
LAB_002a9eb7:
          for (; c_1 == 0; c_1 = getQuaternaries(rightIndex,c_1)) {
            if (rightPair == rightLength) {
              c_1 = 2;
              break;
            }
            uVar3 = (uint)(ushort)_leftIndex[(int)rightPair];
            if (uVar3 < 0x180) {
              local_c4 = (uint)primaries_local[(int)uVar3];
              rightPair = rightPair + 1;
            }
            else {
              rightPair = rightPair + 1;
              local_c4 = lookup(primaries_local,uVar3);
            }
            c_1 = local_c4;
            if (local_c4 < 0xc00) {
              c_1 = nextPair(primaries_local,uVar3,local_c4,_leftIndex,(uint8_t *)0x0,
                             (int32_t *)&rightPair,&rightLength);
            }
          }
          if (c == c_1) {
            if (c == 2) {
              return 0;
            }
            c_1 = 0;
            c = 0;
          }
          else {
            if ((c & 0xffffU) != (c_1 & 0xffffU)) {
              if ((c & 0xffffU) < (c_1 & 0xffffU)) {
                return -1;
              }
              return 1;
            }
            if (c == 2) {
              return 0;
            }
            c = (uint)c >> 0x10;
            c_1 = (uint)c_1 >> 0x10;
          }
        }
        if (leftPair == right_local._4_4_) {
          c = 2;
          goto LAB_002a9eb7;
        }
        uVar3 = (uint)(ushort)pUStack_30[(int)leftPair];
        if (uVar3 < 0x180) {
          local_c0 = (uint)primaries_local[(int)uVar3];
          leftPair = leftPair + 1;
        }
        else {
          leftPair = leftPair + 1;
          local_c0 = lookup(primaries_local,uVar3);
        }
        c = local_c0;
        if (local_c0 < 0xc00) {
          c = nextPair(primaries_local,uVar3,local_c0,pUStack_30,(uint8_t *)0x0,(int32_t *)&leftPair
                       ,(int32_t *)((long)&right_local + 4));
        }
        c = getQuaternaries(rightIndex,c);
      } while( true );
    }
  }
  return 0;
}

Assistant:

int32_t
CollationFastLatin::compareUTF16(const uint16_t *table, const uint16_t *primaries, int32_t options,
                                 const UChar *left, int32_t leftLength,
                                 const UChar *right, int32_t rightLength) {
    // This is a modified copy of CollationCompare::compareUpToQuaternary(),
    // optimized for common Latin text.
    // Keep them in sync!
    // Keep compareUTF16() and compareUTF8() in sync very closely!

    U_ASSERT((table[0] >> 8) == VERSION);
    table += (table[0] & 0xff);  // skip the header
    uint32_t variableTop = (uint32_t)options >> 16;  // see getOptions()
    options &= 0xffff;  // needed for CollationSettings::getStrength() to work

    // Check for supported characters, fetch mini CEs, and compare primaries.
    int32_t leftIndex = 0, rightIndex = 0;
    /**
     * Single mini CE or a pair.
     * The current mini CE is in the lower 16 bits, the next one is in the upper 16 bits.
     * If there is only one, then it is in the lower bits, and the upper bits are 0.
     */
    uint32_t leftPair = 0, rightPair = 0;
    for(;;) {
        // We fetch CEs until we get a non-ignorable primary or reach the end.
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            if(c <= LATIN_MAX) {
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                leftPair = table[c];
            } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                leftPair = table[c - PUNCT_START + LATIN_LIMIT];
            } else {
                leftPair = lookup(table, c);
            }
            if(leftPair >= MIN_SHORT) {
                leftPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(leftPair > variableTop) {
                leftPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                if(leftPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                leftPair = getPrimaries(variableTop, leftPair);
            }
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            if(c <= LATIN_MAX) {
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                rightPair = table[c];
            } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                rightPair = table[c - PUNCT_START + LATIN_LIMIT];
            } else {
                rightPair = lookup(table, c);
            }
            if(rightPair >= MIN_SHORT) {
                rightPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(rightPair > variableTop) {
                rightPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                if(rightPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                rightPair = getPrimaries(variableTop, rightPair);
            }
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftPrimary = leftPair & 0xffff;
        uint32_t rightPrimary = rightPair & 0xffff;
        if(leftPrimary != rightPrimary) {
            // Return the primary difference.
            return (leftPrimary < rightPrimary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    // In the following, we need to re-fetch each character because we did not buffer the CEs,
    // but we know that the string is well-formed and
    // only contains supported characters and mappings.

    // We might skip the secondary level but continue with the case level
    // which is turned on separately.
    if(CollationSettings::getStrength(options) >= UCOL_SECONDARY) {
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                if(c <= LATIN_MAX) {
                    leftPair = table[c];
                } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                    leftPair = table[c - PUNCT_START + LATIN_LIMIT];
                } else {
                    leftPair = lookup(table, c);
                }
                if(leftPair >= MIN_SHORT) {
                    leftPair = getSecondariesFromOneShortCE(leftPair);
                    break;
                } else if(leftPair > variableTop) {
                    leftPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                    leftPair = getSecondaries(variableTop, leftPair);
                }
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                if(c <= LATIN_MAX) {
                    rightPair = table[c];
                } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                    rightPair = table[c - PUNCT_START + LATIN_LIMIT];
                } else {
                    rightPair = lookup(table, c);
                }
                if(rightPair >= MIN_SHORT) {
                    rightPair = getSecondariesFromOneShortCE(rightPair);
                    break;
                } else if(rightPair > variableTop) {
                    rightPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                    rightPair = getSecondaries(variableTop, rightPair);
                }
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftSecondary = leftPair & 0xffff;
            uint32_t rightSecondary = rightPair & 0xffff;
            if(leftSecondary != rightSecondary) {
                if((options & CollationSettings::BACKWARD_SECONDARY) != 0) {
                    // Full support for backwards secondary requires backwards contraction matching
                    // and moving backwards between merge separators.
                    return BAIL_OUT_RESULT;
                }
                return (leftSecondary < rightSecondary) ? UCOL_LESS : UCOL_GREATER;
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }

    if((options & CollationSettings::CASE_LEVEL) != 0) {
        UBool strengthIsPrimary = CollationSettings::getStrength(options) == UCOL_PRIMARY;
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
                if(leftPair < MIN_LONG) {
                    leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                }
                leftPair = getCases(variableTop, strengthIsPrimary, leftPair);
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
                if(rightPair < MIN_LONG) {
                    rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                }
                rightPair = getCases(variableTop, strengthIsPrimary, rightPair);
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftCase = leftPair & 0xffff;
            uint32_t rightCase = rightPair & 0xffff;
            if(leftCase != rightCase) {
                if((options & CollationSettings::UPPER_FIRST) == 0) {
                    return (leftCase < rightCase) ? UCOL_LESS : UCOL_GREATER;
                } else {
                    return (leftCase < rightCase) ? UCOL_GREATER : UCOL_LESS;
                }
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }
    if(CollationSettings::getStrength(options) <= UCOL_SECONDARY) { return UCOL_EQUAL; }

    // Remove the case bits from the tertiary weight when caseLevel is on or caseFirst is off.
    UBool withCaseBits = CollationSettings::isTertiaryWithCaseBits(options);

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
            }
            leftPair = getTertiaries(variableTop, withCaseBits, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
            }
            rightPair = getTertiaries(variableTop, withCaseBits, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftTertiary = leftPair & 0xffff;
        uint32_t rightTertiary = rightPair & 0xffff;
        if(leftTertiary != rightTertiary) {
            if(CollationSettings::sortsTertiaryUpperCaseFirst(options)) {
                // Pass through EOS and MERGE_WEIGHT
                // and keep real tertiary weights larger than the MERGE_WEIGHT.
                // Tertiary CEs (secondary ignorables) are not supported in fast Latin.
                if(leftTertiary > MERGE_WEIGHT) {
                    leftTertiary ^= CASE_MASK;
                }
                if(rightTertiary > MERGE_WEIGHT) {
                    rightTertiary ^= CASE_MASK;
                }
            }
            return (leftTertiary < rightTertiary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    if(CollationSettings::getStrength(options) <= UCOL_TERTIARY) { return UCOL_EQUAL; }

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
            }
            leftPair = getQuaternaries(variableTop, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
            }
            rightPair = getQuaternaries(variableTop, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftQuaternary = leftPair & 0xffff;
        uint32_t rightQuaternary = rightPair & 0xffff;
        if(leftQuaternary != rightQuaternary) {
            return (leftQuaternary < rightQuaternary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    return UCOL_EQUAL;
}